

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

Status cmsys::SystemTools::CopyFileContentBlockwise(string *source,string *destination)

{
  Status SVar1;
  ofstream fout;
  ifstream fin;
  char buffer [4096];
  long local_1420;
  filebuf local_1418 [24];
  byte abStack_1400 [216];
  ios_base local_1328 [264];
  long local_1220;
  long local_1218;
  byte abStack_1200 [488];
  undefined1 local_1018 [4096];
  
  std::ifstream::ifstream(&local_1220,(source->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((abStack_1200[*(long *)(local_1220 + -0x18)] & 5) != 0) {
    SVar1 = Status::POSIX_errno();
    goto LAB_00517d57;
  }
  RemoveFile(destination);
  std::ofstream::ofstream(&local_1420,(destination->_M_dataplus)._M_p,_S_trunc|_S_out|_S_bin);
  if ((abStack_1400[*(long *)(local_1420 + -0x18)] & 5) == 0) {
    if ((abStack_1200[*(long *)(local_1220 + -0x18)] & 5) == 0) {
      do {
        std::istream::read((char *)&local_1220,(long)local_1018);
        if (local_1218 == 0) break;
        std::ostream::write((char *)&local_1420,(long)local_1018);
      } while ((abStack_1200[*(long *)(local_1220 + -0x18)] & 5) == 0);
    }
    std::ostream::flush();
    std::ifstream::close();
    std::ofstream::close();
    if ((abStack_1400[*(long *)(local_1420 + -0x18)] & 5) != 0) goto LAB_00517d1d;
    SVar1.Kind_ = Success;
    SVar1.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
  }
  else {
LAB_00517d1d:
    SVar1 = Status::POSIX_errno();
  }
  local_1420 = _VTT;
  *(undefined8 *)(local_1418 + *(long *)(_VTT + -0x18) + -8) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf(local_1418);
  std::ios_base::~ios_base(local_1328);
LAB_00517d57:
  std::ifstream::~ifstream(&local_1220);
  return SVar1;
}

Assistant:

Status SystemTools::CopyFileContentBlockwise(std::string const& source,
                                             std::string const& destination)
{
  // Open files
  kwsys::ifstream fin(source.c_str(), std::ios::in | std::ios::binary);
  if (!fin) {
    return Status::POSIX_errno();
  }

  // try and remove the destination file so that read only destination files
  // can be written to.
  // If the remove fails continue so that files in read only directories
  // that do not allow file removal can be modified.
  SystemTools::RemoveFile(destination);

  kwsys::ofstream fout(destination.c_str(),
                       std::ios::out | std::ios::trunc | std::ios::binary);
  if (!fout) {
    return Status::POSIX_errno();
  }

  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while (fin) {
    const int bufferSize = 4096;
    char buffer[bufferSize];

    fin.read(buffer, bufferSize);
    if (fin.gcount()) {
      fout.write(buffer, fin.gcount());
    } else {
      break;
    }
  }

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();

  fin.close();
  fout.close();

  if (!fout) {
    return Status::POSIX_errno();
  }

  return Status::Success();
}